

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

bool __thiscall
mkvmuxer::Colour::SetMasteringMetadata(Colour *this,MasteringMetadata *mastering_metadata)

{
  MasteringMetadata *this_00;
  float fVar1;
  bool bVar2;
  MasteringMetadata *this_01;
  
  this_01 = (MasteringMetadata *)operator_new(0x28,(nothrow_t *)&std::nothrow);
  if (this_01 != (MasteringMetadata *)0x0) {
    this_01->b_ = (PrimaryChromaticity *)0x0;
    this_01->white_point_ = (PrimaryChromaticity *)0x0;
    this_01->r_ = (PrimaryChromaticity *)0x0;
    this_01->g_ = (PrimaryChromaticity *)0x0;
    fVar1 = mastering_metadata->luminance_min_;
    this_01->luminance_max_ = mastering_metadata->luminance_max_;
    this_01->luminance_min_ = fVar1;
    bVar2 = MasteringMetadata::SetChromaticity
                      (this_01,mastering_metadata->r_,mastering_metadata->g_,mastering_metadata->b_,
                       mastering_metadata->white_point_);
    if (bVar2) {
      this_00 = this->mastering_metadata_;
      if (this_00 != (MasteringMetadata *)0x0) {
        MasteringMetadata::~MasteringMetadata(this_00);
      }
      operator_delete(this_00);
      this->mastering_metadata_ = this_01;
      return true;
    }
    MasteringMetadata::~MasteringMetadata(this_01);
    operator_delete(this_01);
  }
  return false;
}

Assistant:

bool Colour::SetMasteringMetadata(const MasteringMetadata& mastering_metadata) {
  std::unique_ptr<MasteringMetadata> mm_ptr(new (std::nothrow)
                                                MasteringMetadata());
  if (!mm_ptr)
    return false;

  mm_ptr->set_luminance_max(mastering_metadata.luminance_max());
  mm_ptr->set_luminance_min(mastering_metadata.luminance_min());

  if (!mm_ptr->SetChromaticity(mastering_metadata.r(), mastering_metadata.g(),
                               mastering_metadata.b(),
                               mastering_metadata.white_point())) {
    return false;
  }

  delete mastering_metadata_;
  mastering_metadata_ = mm_ptr.release();
  return true;
}